

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

void __thiscall pg::QPTSolver::liftloop(QPTSolver *this)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int target;
  ostream *poVar4;
  Game *pGVar5;
  Error *this_00;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  int from;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  _label_vertex local_40;
  
  lVar8 = ((this->super_Solver).game)->n_vertices;
  if (0 < this->k * lVar8) {
    piVar14 = this->pm_nodes;
    lVar7 = 0;
    do {
      piVar14[lVar7] = -1;
      lVar7 = lVar7 + 1;
      lVar9 = this->k * lVar8;
    } while (lVar9 - lVar7 != 0 && lVar7 <= lVar9);
  }
  if (0 < lVar8) {
    memset(this->strategy,0xff,lVar8 * 4);
  }
  uVar12 = (int)lVar8 - 1;
  if (-1 < (int)uVar12) {
    uVar13 = (ulong)uVar12;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar3 = lift(this,(int)uVar13,-1);
        if (bVar3) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,(int)uVar13);
        }
      }
      bVar3 = 0 < (long)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar3);
  }
  while ((this->todo).pointer != 0) {
    target = todo_pop(this);
    pGVar5 = (this->super_Solver).game;
    piVar14 = pGVar5->_inedges;
    lVar8 = (long)pGVar5->_firstins[target];
    iVar6 = piVar14[lVar8];
    if (iVar6 != -1) {
      piVar14 = piVar14 + lVar8 + 1;
      do {
        if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar6 >> 6] >>
             ((long)iVar6 & 0x3fU) & 1) == 0) {
          this->lift_attempt = this->lift_attempt + 1;
          bVar3 = lift(this,iVar6,target);
          if (bVar3) {
            this->lift_count = this->lift_count + 1;
            todo_push(this,iVar6);
          }
        }
        iVar6 = *piVar14;
        piVar14 = piVar14 + 1;
      } while (iVar6 != -1);
    }
  }
  if (((this->super_Solver).trace != 0) && (0 < ((this->super_Solver).game)->n_vertices)) {
    uVar13 = 0;
    do {
      uVar11 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar11] >> (uVar13 & 0x3f) & 1) == 0) {
        poVar4 = (this->super_Solver).logger;
        piVar14 = this->pm_nodes;
        iVar6 = this->k;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[1m",4);
        local_40.g = (this->super_Solver).game;
        local_40.v = (int)uVar13;
        poVar4 = operator<<(poVar4,&local_40);
        bVar3 = ((((this->super_Solver).game)->_owner)._bits[uVar11] >> (uVar13 & 0x3f) & 1) != 0;
        pcVar10 = " (odd)";
        if (!bVar3) {
          pcVar10 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,7 - (ulong)bVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m:",4);
        pm_stream((this->super_Solver).logger,piVar14 + (long)iVar6 * (long)(int)uVar13,this->k);
        uVar12 = piVar14[(long)iVar6 * (long)(int)uVar13];
        if (((uVar12 == 0xffffffff) || ((uVar12 & 1) != this->pl)) &&
           (this->pl !=
            (uint)(((((this->super_Solver).game)->_owner)._bits[uVar11] & 1L << (uVar13 & 0x3f)) !=
                  0))) {
          poVar4 = (this->super_Solver).logger;
          if (this->strategy[uVar13] == -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," no strategy!",0xd);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," => ",4);
            local_40.g = (this->super_Solver).game;
            local_40.v = this->strategy[uVar13];
            operator<<(poVar4,&local_40);
          }
        }
        poVar4 = (this->super_Solver).logger;
        cVar1 = (char)poVar4;
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < ((this->super_Solver).game)->n_vertices);
  }
  pGVar5 = (this->super_Solver).game;
  if (0 < pGVar5->n_vertices) {
    uVar13 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
        if ((this->pm_nodes[(long)(int)uVar13 * (long)this->k] == 0xffffffff) ||
           ((this->pm_nodes[(long)(int)uVar13 * (long)this->k] & 1U) != this->pl)) {
          uVar2 = (uint)(((pGVar5->_owner)._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0);
          uVar12 = this->pl;
          if ((uVar12 != uVar2) && (this->strategy[uVar13] == -1)) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/qpt.cpp"
                         ,0x1d4);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          iVar6 = -1;
          if (uVar12 != uVar2) {
            iVar6 = this->strategy[uVar13];
          }
          Oink::solve((this->super_Solver).oink,(int)uVar13,1 - uVar12,iVar6);
        }
      }
      uVar13 = uVar13 + 1;
      pGVar5 = (this->super_Solver).game;
    } while ((long)uVar13 < pGVar5->n_vertices);
  }
  Oink::flush((this->super_Solver).oink);
  return;
}

Assistant:

void
QPTSolver::liftloop()
{
    /**
     * Initialize/reset progress measures / strategy
     */
    for (int i=0; i<k*nodecount(); i++) pm_nodes[i] = -1; // initialize all to _
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    /**
     * Run first lifting loop
     */
    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        if (lift(n, -1)) {
            lift_count++;
#if 0
            for (int from : in[n]) {
                if (disabled[from]) continue;
                lift_attempt++;
                if (lift(from, n)) {
                    lift_count++;
                    todo_push(from);
                }
            }
#else
            todo_push(n);
#endif
        }
    }

    /**
     * Lift until fixed point
     */
    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            if (lift(from, n)) {
                lift_count++;
                todo_push(from);
            }
        }
    }

    /**
     * Report final state.
     */
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            int *pm = pm_nodes + v*k;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            pm_stream(logger, pm, k);

            if (pm[0] == -1 or (pm[0]&1) != pl) {
                if (owner(v) != pl) {
                    if (strategy[v] == -1) logger << " no strategy!";
                    else logger << " => " << label_vertex(strategy[v]);
                }
            }
            
            logger << std::endl;
        }
    }

    /**
     * Derive strategies, mark as solved (only for opponent).
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        int *pm = pm_nodes + v*k;

        if (pm[0] == -1 or (pm[0]&1) != pl) {
            if (owner(v) != pl and strategy[v] == -1) LOGIC_ERROR;
            Solver::solve(v, 1-pl, owner(v) != pl ? strategy[v] : -1);
        }
    }

    Solver::flush();
}